

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls_stg1.c
# Opt level: O2

int cvNlsLSolveSensStg1(N_Vector delta,void *cvode_mem)

{
  int iVar1;
  int iVar2;
  
  if (cvode_mem == (void *)0x0) {
    iVar2 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0xf3,"cvNlsLSolveSensStg1",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg1.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    iVar1 = (**(code **)((long)cvode_mem + 2000))
                      (cvode_mem,delta,
                       *(undefined8 *)
                        (*(long *)((long)cvode_mem + 0x2f0) +
                        (long)*(int *)((long)cvode_mem + 0x764) * 8),
                       *(undefined8 *)((long)cvode_mem + 0x1c0),
                       *(undefined8 *)((long)cvode_mem + 0x1d8));
    if (iVar1 < 0) {
      iVar2 = -7;
    }
    else {
      iVar2 = 0x386;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int cvNlsLSolveSensStg1(N_Vector delta, void* cvode_mem)
{
  CVodeMem cv_mem;
  int retval, is;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* get index of current sensitivity solve */
  is = cv_mem->sens_solve_idx;

  /* solve the sensitivity linear systems */
  retval = cv_mem->cv_lsolve(cv_mem, delta, cv_mem->cv_ewtS[is], cv_mem->cv_y,
                             cv_mem->cv_ftemp);

  if (retval < 0) { return (CV_LSOLVE_FAIL); }
  if (retval > 0) { return (SUN_NLS_CONV_RECVR); }

  return (CV_SUCCESS);
}